

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O1

ON_XMLProperty * __thiscall
ON_XMLNodePrivate::AttachProperty(ON_XMLNodePrivate *this,ON_XMLProperty *prop)

{
  ON_XMLPropertyPrivate *pOVar1;
  int iVar2;
  undefined4 extraout_var;
  wchar_t *name;
  
  if (prop == (ON_XMLProperty *)0x0) {
    prop = (ON_XMLProperty *)0x0;
  }
  else {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mutex);
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    iVar2 = (*prop->_vptr_ON_XMLProperty[2])(prop);
    name = ON_wString::operator_cast_to_wchar_t_((ON_wString *)CONCAT44(extraout_var,iVar2));
    RemoveProperty(this,name);
    pOVar1 = prop->_private;
    pOVar1->_next = this->m_first_property;
    this->m_first_property = prop;
    pOVar1->_owner = this->m_node;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  }
  return prop;
}

Assistant:

ON_XMLProperty* ON_XMLNodePrivate::AttachProperty(ON_XMLProperty* prop)
{
  if (nullptr == prop)
    return nullptr;

  std::lock_guard<std::recursive_mutex> lg(m_mutex);

  RemoveProperty(prop->Name());

  prop->_private->_next = m_first_property;
  m_first_property = prop;
  m_first_property->_private->_owner = &m_node;

  return prop;
}